

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

bool __thiscall testing::internal::FilePath::CreateDirectoriesRecursively(FilePath *this)

{
  size_type sVar1;
  int iVar2;
  FilePath *path;
  bool bVar3;
  undefined1 local_c8 [8];
  FilePath parent;
  FilePath local_38;
  
  sVar1 = (this->pathname_)._M_string_length;
  if (sVar1 == 0) {
    bVar3 = false;
  }
  else {
    bVar3 = (this->pathname_)._M_dataplus._M_p[sVar1 - 1] == '/';
    if (bVar3 && sVar1 != 0) {
      iVar2 = stat((this->pathname_)._M_dataplus._M_p,(stat *)local_c8);
      if ((iVar2 != 0) ||
         (bVar3 = true, (parent.pathname_.field_2._M_allocated_capacity._0_4_ & 0xf000) != 0x4000))
      {
        RemoveTrailingPathSeparator(&local_38,this);
        RemoveFileName((FilePath *)local_c8,&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38.pathname_._M_dataplus._M_p != &local_38.pathname_.field_2) {
          operator_delete(local_38.pathname_._M_dataplus._M_p,
                          local_38.pathname_.field_2._M_allocated_capacity + 1);
        }
        bVar3 = CreateDirectoriesRecursively((FilePath *)local_c8);
        if (bVar3) {
          bVar3 = CreateFolder(this);
        }
        else {
          bVar3 = false;
        }
        if (local_c8 != (undefined1  [8])&parent.pathname_._M_string_length) {
          operator_delete((void *)local_c8,parent.pathname_._M_string_length + 1);
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool FilePath::CreateDirectoriesRecursively() const {
  if (!this->IsDirectory()) {
    return false;
  }

  if (pathname_.length() == 0 || this->DirectoryExists()) {
    return true;
  }

  const FilePath parent(this->RemoveTrailingPathSeparator().RemoveFileName());
  return parent.CreateDirectoriesRecursively() && this->CreateFolder();
}